

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_cast.cpp
# Opt level: O3

bool duckdb::StructToStructCast
               (Vector *source,Vector *result,idx_t count,CastParameters *parameters)

{
  BoundCastData *pBVar1;
  FunctionLocalState *pFVar2;
  size_type __n;
  size_type __n_00;
  _Head_base<0UL,_duckdb::BoundCastData_*,_false> _Var3;
  unsigned_long *puVar4;
  bool bVar5;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true> *this;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *this_00;
  reference pvVar6;
  reference pvVar7;
  type pVVar8;
  type pVVar9;
  reference pvVar10;
  reference pvVar11;
  bool bVar12;
  idx_t i;
  size_type sVar13;
  CastParameters child_parameters;
  CastParameters local_60;
  
  optional_ptr<duckdb::BoundCastData,_true>::CheckValid(&parameters->cast_data);
  pBVar1 = (parameters->cast_data).ptr;
  optional_ptr<duckdb::FunctionLocalState,_true>::CheckValid(&parameters->local_state);
  pFVar2 = (parameters->local_state).ptr;
  this = StructVector::GetEntries(source);
  this_00 = StructVector::GetEntries(result);
  if (pBVar1[8]._vptr_BoundCastData == pBVar1[7]._vptr_BoundCastData) {
    bVar12 = true;
  }
  else {
    bVar12 = true;
    sVar13 = 0;
    do {
      pvVar6 = vector<unsigned_long,_true>::operator[]
                         ((vector<unsigned_long,_true> *)(pBVar1 + 7),sVar13);
      __n = *pvVar6;
      pvVar6 = vector<unsigned_long,_true>::operator[]
                         ((vector<unsigned_long,_true> *)(pBVar1 + 10),sVar13);
      __n_00 = *pvVar6;
      pvVar7 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
               ::operator[](this,__n);
      pVVar8 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                         (pvVar7);
      pvVar7 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
               ::operator[](this_00,__n_00);
      pVVar9 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                         (pvVar7);
      pvVar10 = vector<duckdb::BoundCastInfo,_true>::operator[]
                          ((vector<duckdb::BoundCastInfo,_true> *)(pBVar1 + 1),sVar13);
      _Var3._M_head_impl =
           (pvVar10->cast_data).
           super_unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>._M_t
           .
           super___uniq_ptr_impl<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>
           .super__Head_base<0UL,_duckdb::BoundCastData_*,_false>._M_head_impl;
      pvVar11 = vector<duckdb::unique_ptr<duckdb::FunctionLocalState,_std::default_delete<duckdb::FunctionLocalState>,_true>,_true>
                ::operator[]((vector<duckdb::unique_ptr<duckdb::FunctionLocalState,_std::default_delete<duckdb::FunctionLocalState>,_true>,_true>
                              *)(pFVar2 + 1),sVar13);
      local_60.local_state.ptr =
           (pvVar11->
           super_unique_ptr<duckdb::FunctionLocalState,_std::default_delete<duckdb::FunctionLocalState>_>
           )._M_t.
           super___uniq_ptr_impl<duckdb::FunctionLocalState,_std::default_delete<duckdb::FunctionLocalState>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::FunctionLocalState_*,_std::default_delete<duckdb::FunctionLocalState>_>
           .super__Head_base<0UL,_duckdb::FunctionLocalState_*,_false>._M_head_impl;
      local_60.strict = parameters->strict;
      local_60.error_message = parameters->error_message;
      local_60.query_location.index = (parameters->query_location).index;
      local_60.nullify_parent = false;
      local_60.cast_data.ptr = _Var3._M_head_impl;
      bVar5 = (*pvVar10->function)(pVVar8,pVVar9,count,&local_60);
      bVar12 = (bool)(bVar12 & bVar5);
      sVar13 = sVar13 + 1;
    } while (sVar13 < (ulong)((long)pBVar1[8]._vptr_BoundCastData -
                              (long)pBVar1[7]._vptr_BoundCastData >> 3));
  }
  if (pBVar1[0xd]._vptr_BoundCastData != pBVar1[0xe]._vptr_BoundCastData) {
    sVar13 = 0;
    do {
      pvVar6 = vector<unsigned_long,_true>::operator[]
                         ((vector<unsigned_long,_true> *)(pBVar1 + 0xd),sVar13);
      pvVar7 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
               ::operator[](this_00,*pvVar6);
      pVVar8 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                         (pvVar7);
      Vector::SetVectorType(pVVar8,CONSTANT_VECTOR);
      ConstantVector::SetNull(pVVar8,true);
      sVar13 = sVar13 + 1;
    } while (sVar13 < (ulong)((long)pBVar1[0xe]._vptr_BoundCastData -
                              (long)pBVar1[0xd]._vptr_BoundCastData >> 3));
  }
  if (source->vector_type == CONSTANT_VECTOR) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    puVar4 = (source->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if (puVar4 == (unsigned_long *)0x0) {
      bVar5 = false;
    }
    else {
      bVar5 = (*puVar4 & 1) == 0;
    }
    ConstantVector::SetNull(result,bVar5);
  }
  else {
    Vector::Flatten(source,count);
    FlatVector::VerifyFlatVector(result);
    FlatVector::VerifyFlatVector(source);
    (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
         (source->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
              (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
               &(source->validity).super_TemplatedValidityMask<unsigned_long>.validity_data);
    (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
         (source->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
    Vector::Verify(result,count);
  }
  return bVar12;
}

Assistant:

static bool StructToStructCast(Vector &source, Vector &result, idx_t count, CastParameters &parameters) {
	auto &cast_data = parameters.cast_data->Cast<StructBoundCastData>();
	auto &l_state = parameters.local_state->Cast<StructCastLocalState>();

	auto &source_vectors = StructVector::GetEntries(source);
	auto &target_children = StructVector::GetEntries(result);

	bool all_converted = true;
	for (idx_t i = 0; i < cast_data.source_indexes.size(); i++) {
		auto source_idx = cast_data.source_indexes[i];
		auto target_idx = cast_data.target_indexes[i];

		auto &source_vector = *source_vectors[source_idx];
		auto &target_vector = *target_children[target_idx];

		auto &child_cast_info = cast_data.child_cast_info[i];
		CastParameters child_parameters(parameters, child_cast_info.cast_data, l_state.local_states[i]);
		auto success = child_cast_info.function(source_vector, target_vector, count, child_parameters);
		if (!success) {
			all_converted = false;
		}
	}

	if (!cast_data.target_null_indexes.empty()) {
		for (idx_t i = 0; i < cast_data.target_null_indexes.size(); i++) {
			auto target_idx = cast_data.target_null_indexes[i];
			auto &target_vector = *target_children[target_idx];

			target_vector.SetVectorType(VectorType::CONSTANT_VECTOR);
			ConstantVector::SetNull(target_vector, true);
		}
	}

	if (source.GetVectorType() == VectorType::CONSTANT_VECTOR) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
		ConstantVector::SetNull(result, ConstantVector::IsNull(source));
		return all_converted;
	}

	source.Flatten(count);
	auto &result_validity = FlatVector::Validity(result);
	result_validity = FlatVector::Validity(source);
	result.Verify(count);
	return all_converted;
}